

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O0

void __thiscall Buffer::Members::Members(Members *this,string *content)

{
  size_t sVar1;
  uchar *puVar2;
  string *content_local;
  Members *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)content);
  this->own_memory = false;
  sVar1 = std::__cxx11::string::size();
  this->size = sVar1;
  puVar2 = (uchar *)std::__cxx11::string::data();
  this->buf = puVar2;
  return;
}

Assistant:

Buffer::Members::Members(std::string&& content) :
    str(std::move(content)),
    own_memory(false),
    size(str.size()),
    buf(reinterpret_cast<unsigned char*>(str.data()))
{
}